

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitArrayCopy(FunctionValidator *this,ArrayCopy *curr)

{
  Type TVar1;
  bool bVar2;
  HeapType HVar3;
  HeapType HVar4;
  Type local_68;
  PackedType local_60;
  Type local_58;
  PackedType local_50;
  int local_4c;
  Type local_48;
  Type local_40;
  HeapType local_38;
  HeapType srcHeapType;
  HeapType destHeapType;
  
  shouldBeTrue<wasm::ArrayCopy*>
            (this,(bool)((byte)((((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .currModule)->features).features >> 10) & 1),curr,
             "array.copy requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayCopy*,wasm::Type>
            (this,(Type)(curr->srcIndex->type).id,(Type)0x2,curr,
             "array.copy src index must be an i32");
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayCopy*,wasm::Type>
            (this,(Type)(curr->destIndex->type).id,(Type)0x2,curr,
             "array.copy dest index must be an i32");
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.type.id != 1) {
    TVar1.id = (curr->srcRef->type).id;
    wasm::Type::Type(&local_48,(HeapType)0x6,Nullable);
    bVar2 = shouldBeSubType(this,TVar1,local_48,(Expression *)curr,
                            "array.copy source should be an array reference");
    if (bVar2) {
      TVar1.id = (curr->destRef->type).id;
      wasm::Type::Type(&local_40,(HeapType)0x6,Nullable);
      bVar2 = shouldBeSubType(this,TVar1,local_40,(Expression *)curr,
                              "array.copy destination should be an array reference");
      if (bVar2) {
        HVar3 = wasm::Type::getHeapType(&curr->srcRef->type);
        local_38 = HVar3;
        HVar4 = wasm::Type::getHeapType(&curr->destRef->type);
        if (HVar3.id != 0xb) {
          srcHeapType.id = HVar4.id;
          bVar2 = HeapType::isArray(&local_38);
          bVar2 = shouldBeTrue<wasm::ArrayCopy*>
                            (this,bVar2,curr,"array.copy source should be an array reference");
          if (HVar4.id != 0xb && bVar2) {
            bVar2 = HeapType::isArray(&srcHeapType);
            bVar2 = shouldBeTrue<wasm::ArrayCopy*>
                              (this,bVar2,curr,"array.copy destination should be an array reference"
                              );
            if (bVar2) {
              HeapType::getArray((HeapType *)&local_68);
              HeapType::getArray((HeapType *)&local_58);
              shouldBeSubType(this,local_68,local_58,(Expression *)curr,
                              "array.copy must have the proper types");
              shouldBeEqual<wasm::ArrayCopy*,wasm::Field::PackedType>
                        (this,local_60,local_50,curr,"array.copy types must match");
              shouldBeTrue<wasm::ArrayCopy*>
                        (this,local_4c != 0,curr,"array.copy destination must be mutable");
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayCopy(ArrayCopy* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "array.copy requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(curr->srcIndex->type,
                                    Type(Type::i32),
                                    curr,
                                    "array.copy src index must be an i32");
  shouldBeEqualOrFirstIsUnreachable(curr->destIndex->type,
                                    Type(Type::i32),
                                    curr,
                                    "array.copy dest index must be an i32");
  if (curr->type == Type::unreachable) {
    return;
  }
  if (!shouldBeSubType(curr->srcRef->type,
                       Type(HeapType::array, Nullable),
                       curr,
                       "array.copy source should be an array reference")) {
    return;
  }
  if (!shouldBeSubType(curr->destRef->type,
                       Type(HeapType::array, Nullable),
                       curr,
                       "array.copy destination should be an array reference")) {
    return;
  }
  auto srcHeapType = curr->srcRef->type.getHeapType();
  auto destHeapType = curr->destRef->type.getHeapType();
  if (srcHeapType == HeapType::none ||
      !shouldBeTrue(srcHeapType.isArray(),
                    curr,
                    "array.copy source should be an array reference")) {
    return;
  }
  if (destHeapType == HeapType::none ||
      !shouldBeTrue(destHeapType.isArray(),
                    curr,
                    "array.copy destination should be an array reference")) {
    return;
  }
  const auto& srcElement = srcHeapType.getArray().element;
  const auto& destElement = destHeapType.getArray().element;
  shouldBeSubType(srcElement.type,
                  destElement.type,
                  curr,
                  "array.copy must have the proper types");
  shouldBeEqual(srcElement.packedType,
                destElement.packedType,
                curr,
                "array.copy types must match");
  shouldBeTrue(
    destElement.mutable_, curr, "array.copy destination must be mutable");
}